

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O2

Rvl_t duckdb_lz4::read_variable_length(BYTE **ip,BYTE *ilimit,int initial_check)

{
  byte bVar1;
  byte *pbVar2;
  Rvl_t RVar3;
  byte *pbVar4;
  
  if (*ip < ilimit || initial_check == 0) {
    RVar3 = 0;
    pbVar2 = *ip;
    while( true ) {
      pbVar4 = pbVar2 + 1;
      bVar1 = *pbVar2;
      *ip = pbVar4;
      if (ilimit < pbVar4) break;
      RVar3 = RVar3 + bVar1;
      pbVar2 = pbVar4;
      if ((ulong)bVar1 != 0xff) {
        return RVar3;
      }
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

LZ4_FORCE_INLINE Rvl_t
read_variable_length(const BYTE** ip, const BYTE* ilimit,
                     int initial_check)
{
    Rvl_t s, length = 0;
    assert(ip != NULL);
    assert(*ip !=  NULL);
    assert(ilimit != NULL);
    if (initial_check && unlikely((*ip) >= ilimit)) {    /* read limit reached */
        return rvl_error;
    }
    do {
        s = **ip;
        (*ip)++;
        length += s;
        if (unlikely((*ip) > ilimit)) {    /* read limit reached */
            return rvl_error;
        }
        /* accumulator overflow detection (32-bit mode only) */
        if ((sizeof(length)<8) && unlikely(length > ((Rvl_t)(-1)/2)) ) {
            return rvl_error;
        }
    } while (s==255);

    return length;
}